

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

bool qt_PersistentModelIndexLessThan(QPersistentModelIndex *i1,QPersistentModelIndex *i2)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined8 local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::parent((QModelIndex *)&local_48,i1);
  local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::parent((QModelIndex *)&local_68,i2);
  if (((((int)local_48 == (int)local_68) && (local_48._4_4_ == local_68._4_4_)) &&
      (puStack_40 == puStack_60)) && (local_38.ptr == local_58.ptr)) {
    bVar1 = operator<(i1,i2);
  }
  else {
    bVar1 = operator<((QModelIndex *)&local_48,(QModelIndex *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool qt_PersistentModelIndexLessThan(const QPersistentModelIndex &i1, const QPersistentModelIndex &i2)
{
    const QModelIndex parent1 = i1.parent();
    const QModelIndex parent2 = i2.parent();
    return parent1 == parent2 ? i1 < i2 : parent1 < parent2;
}